

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

void __thiscall
fmt::v11::detail::format_error_code
          (detail *this,buffer<char> *out,int error_code,string_view message)

{
  string_view fmt;
  string_view fmt_00;
  bool bVar1;
  int value;
  make_unsigned_t<int> mVar2;
  size_t sVar3;
  undefined4 in_register_00000014;
  basic_string_view<char> bVar4;
  anon_class_1_0_00000001 local_202 [2];
  char *local_200;
  size_t local_1f8;
  buffer<char> *local_1f0;
  anon_class_1_0_00000001 local_1e2 [2];
  char *local_1e0;
  size_t local_1d8;
  basic_appender<char> local_1d0;
  appender it;
  long lStack_1c0;
  uint32_or_64_or_128_t<int> abs_value;
  size_t error_code_size;
  buffer<char> *pbStack_1b0;
  int error_code_local;
  buffer<char> *out_local;
  string_view message_local;
  format_args local_178;
  int local_124;
  char *pcStack_120;
  int unused;
  string_view sv;
  char *local_f8 [2];
  uint32_t local_e8;
  format_args local_d8;
  char *local_c8;
  size_t sStack_c0;
  long local_b8;
  char *local_b0;
  basic_appender<char> *local_a8;
  char *local_a0;
  size_t sStack_98;
  buffer<char> *local_90;
  int local_84;
  char *pcStack_80;
  int unused_1;
  string_view sv_1;
  
  out_local = (buffer<char> *)CONCAT44(in_register_00000014,error_code);
  message_local.data_ = message.data_;
  error_code_size._4_4_ = (uint32_t)out;
  pbStack_1b0 = (buffer<char> *)this;
  buffer<char>::try_resize((buffer<char> *)this,0);
  lStack_1c0 = 8;
  it.container._4_4_ = error_code_size._4_4_;
  bVar1 = is_negative<int,_0>(error_code_size._4_4_);
  if (bVar1) {
    it.container._4_4_ = -it.container._4_4_;
    lStack_1c0 = 9;
  }
  value = count_digits(it.container._4_4_);
  mVar2 = to_unsigned<int>(value);
  basic_appender<char>::basic_appender(&local_1d0,pbStack_1b0);
  sVar3 = basic_string_view<char>::size((basic_string_view<char> *)&out_local);
  if (sVar3 <= 500 - (lStack_1c0 + (ulong)mVar2)) {
    format_error_code::anon_class_1_0_00000001::operator()(local_1e2);
    bVar4 = v11::operator()((v11 *)((long)&sv.size_ + 7));
    local_1d8 = bVar4.size_;
    local_1e0 = bVar4.data_;
    pcStack_120 = "{}{}";
    sv.data_ = (char *)0x4;
    local_124 = 0;
    ignore_unused<int>(&local_124);
    value<fmt::v11::context>::value<fmt::v11::basic_string_view<char>,_char,_0>
              ((value<fmt::v11::context> *)&message_local.size_,
               (basic_string_view<char> *)&out_local);
    local_178.desc_ = 0xcd;
    local_178.field_1 =
         (anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2)&message_local.size_;
    fmt.size_ = local_1d8;
    fmt.data_ = local_1e0;
    local_1f0 = (buffer<char> *)
                vformat_to<fmt::v11::basic_appender<char>_&,_0>(&local_1d0,fmt,local_178);
  }
  format_error_code::anon_class_1_0_00000001::operator()(local_202);
  bVar4 = v11::operator()((v11 *)((long)&sv_1.size_ + 7));
  local_1f8 = bVar4.size_;
  local_200 = bVar4.data_;
  pcStack_80 = "{}{}";
  sv_1.data_ = (char *)0x4;
  local_84 = 0;
  ignore_unused<int>(&local_84);
  local_a0 = local_200;
  sStack_98 = local_1f8;
  local_a8 = &local_1d0;
  local_b0 = "error ";
  local_b8 = (long)&error_code_size + 4;
  local_c8 = local_200;
  sStack_c0 = local_1f8;
  local_f8[0] = "error ";
  local_e8 = error_code_size._4_4_;
  local_d8.desc_ = 0x1c;
  local_d8.field_1 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2)local_f8;
  fmt_00.size_ = local_1f8;
  fmt_00.data_ = local_200;
  local_90 = (buffer<char> *)
             vformat_to<fmt::v11::basic_appender<char>_&,_0>(local_a8,fmt_00,local_d8);
  sVar3 = buffer<char>::size(pbStack_1b0);
  if (500 < sVar3) {
    assert_fail("/workspace/llm4binary/github/license_c_cmakelists/DiscordPP[P]echo-bot/build_O0/_deps/fmt-src/include/fmt/format-inl.h"
                ,0x3f,"");
  }
  return;
}

Assistant:

FMT_FUNC void format_error_code(detail::buffer<char>& out, int error_code,
                                string_view message) noexcept {
  // Report error code making sure that the output fits into
  // inline_buffer_size to avoid dynamic memory allocation and potential
  // bad_alloc.
  out.try_resize(0);
  static const char SEP[] = ": ";
  static const char ERROR_STR[] = "error ";
  // Subtract 2 to account for terminating null characters in SEP and ERROR_STR.
  size_t error_code_size = sizeof(SEP) + sizeof(ERROR_STR) - 2;
  auto abs_value = static_cast<uint32_or_64_or_128_t<int>>(error_code);
  if (detail::is_negative(error_code)) {
    abs_value = 0 - abs_value;
    ++error_code_size;
  }
  error_code_size += detail::to_unsigned(detail::count_digits(abs_value));
  auto it = appender(out);
  if (message.size() <= inline_buffer_size - error_code_size)
    fmt::format_to(it, FMT_STRING("{}{}"), message, SEP);
  fmt::format_to(it, FMT_STRING("{}{}"), ERROR_STR, error_code);
  FMT_ASSERT(out.size() <= inline_buffer_size, "");
}